

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O0

void conv_directx(double *inp1,int N,double *inp2,int L,double *oup)

{
  int local_3c;
  int local_38;
  int n;
  int k;
  int M;
  double *oup_local;
  int L_local;
  double *inp2_local;
  int N_local;
  double *inp1_local;
  
  for (local_38 = 0; local_38 < N + L + -1; local_38 = local_38 + 1) {
    oup[local_38] = 0.0;
    for (local_3c = 0; local_3c < N; local_3c = local_3c + 1) {
      if ((-1 < local_38 - local_3c) && (local_38 - local_3c < L)) {
        oup[local_38] = inp1[local_3c] * inp2[local_38 - local_3c] + oup[local_38];
      }
    }
  }
  return;
}

Assistant:

void conv_directx(fft_type *inp1,int N, fft_type *inp2, int L,fft_type *oup){
	int M,k,n;
	
	M = N + L - 1;
	
	for (k = 0; k < M;++k) {
		oup[k] = 0.0;
		for ( n = 0; n < N; ++n) {
			if ( (k-n) >= 0 && (k-n) < L ) {
				oup[k]+= inp1[n] * inp2[k-n];
			}
		}
		
	}
		
}